

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall
helics::FilterFederate::acceptDestProcessReturn
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid)

{
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  mapped_type *pmVar1;
  BaseType fid_index;
  ActionMessage unblock;
  
  fid_index = fid.gid;
  this_00 = &std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ongoingDestFilterProcesses,&fid_index)->_M_t;
  unblock.messageAction = pid;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (this_00,&unblock.messageAction);
  pmVar1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::operator[](&this->ongoingDestFilterProcesses,&fid_index);
  if ((pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ActionMessage::ActionMessage(&unblock,cmd_time_unblock);
    unblock.source_id.gid = (this->mFedID).gid;
    unblock.dest_id.gid = fid.gid;
    unblock.sequenceID = pid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()(&this->mSendMessage,&unblock);
    ActionMessage::~ActionMessage(&unblock);
  }
  clearTimeReturn(this,pid);
  return;
}

Assistant:

void FilterFederate::acceptDestProcessReturn(GlobalFederateId fid, uint32_t pid)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    ongoingDestFilterProcesses[fid_index].erase(pid);
    if (ongoingDestFilterProcesses[fid_index].empty()) {
        ActionMessage unblock(CMD_TIME_UNBLOCK);
        unblock.dest_id = fid;
        unblock.source_id = mFedID;
        unblock.sequenceID = pid;
        mSendMessage(unblock);
    }
    clearTimeReturn(pid);
}